

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O3

Real nga_sdot_patch_(Integer *g_a,char *t_a,Integer *alo,Integer *ahi,Integer *g_b,char *t_b,
                    Integer *blo,Integer *bhi,int alen,int blen)

{
  Integer btype;
  Real retval;
  Integer atype;
  
  pnga_inquire_type(*g_a,&atype);
  pnga_inquire_type(*g_b,&btype);
  if ((atype != 0x3eb) || (btype != 0x3eb)) {
    pnga_error(" wrong types ",0);
  }
  pnga_dot_patch(*g_a,t_a,alo,ahi,*g_b,t_b,blo,bhi,&retval);
  return retval;
}

Assistant:

Real nga_sdot_patch_(Integer *g_a, char *t_a, int alen, Integer *alo, Integer *ahi, Integer *g_b, char *t_b, int blen, Integer *blo, Integer *bhi)
#endif
{
    Real retval;
    Integer atype, btype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    if (atype != btype || atype != C_FLOAT) pnga_error(" wrong types ", 0L);
    wnga_dot_patch(*g_a, t_a, alo, ahi, *g_b, t_b, blo, bhi, &retval);

    return retval;
}